

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SnapshotTextFormatter.cpp
# Opt level: O1

ostream * __thiscall
cali::SnapshotTextFormatter::SnapshotTextFormatterImpl::print
          (SnapshotTextFormatterImpl *this,ostream *os,CaliperMetadataAccessInterface *db,
          vector<cali::Entry,_std::allocator<cali::Entry>_> *list)

{
  mutex *__mutex;
  Node *pNVar1;
  size_type sVar2;
  pointer pFVar3;
  pointer pFVar4;
  SnapshotTextFormatterImpl *pSVar5;
  pthread_mutex_t *__mutex_00;
  int iVar6;
  cali_attr_type cVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  anon_union_8_7_33918203_for_value aVar9;
  cali_id_t cVar10;
  char *pcVar11;
  ostream *poVar12;
  size_t sVar13;
  char cVar14;
  uint64_t uVar15;
  pointer this_00;
  Node *node;
  Node *pNVar16;
  pointer pFVar17;
  string str;
  vector<cali::SnapshotTextFormatter::SnapshotTextFormatterImpl::Field,_std::allocator<cali::SnapshotTextFormatter::SnapshotTextFormatterImpl::Field>_>
  fields;
  char *local_c8;
  long local_c0;
  char local_b8;
  undefined7 uStack_b7;
  vector<cali::SnapshotTextFormatter::SnapshotTextFormatterImpl::Field,_std::allocator<cali::SnapshotTextFormatter::SnapshotTextFormatterImpl::Field>_>
  local_a8;
  ostream *local_90;
  string local_88;
  ulong local_68;
  Variant local_60;
  SnapshotTextFormatterImpl *local_50;
  pthread_mutex_t *local_48;
  CaliperMetadataAccessInterface *local_40;
  pointer local_38;
  undefined8 uVar8;
  
  local_a8.
  super__Vector_base<cali::SnapshotTextFormatter::SnapshotTextFormatterImpl::Field,_std::allocator<cali::SnapshotTextFormatter::SnapshotTextFormatterImpl::Field>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.
  super__Vector_base<cali::SnapshotTextFormatter::SnapshotTextFormatterImpl::Field,_std::allocator<cali::SnapshotTextFormatter::SnapshotTextFormatterImpl::Field>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8.
  super__Vector_base<cali::SnapshotTextFormatter::SnapshotTextFormatterImpl::Field,_std::allocator<cali::SnapshotTextFormatter::SnapshotTextFormatterImpl::Field>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __mutex = &this->m_field_mutex;
  local_90 = os;
  local_40 = db;
  iVar6 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar6 != 0) {
    std::__throw_system_error(iVar6);
  }
  std::
  vector<cali::SnapshotTextFormatter::SnapshotTextFormatterImpl::Field,std::allocator<cali::SnapshotTextFormatter::SnapshotTextFormatterImpl::Field>>
  ::
  _M_assign_aux<__gnu_cxx::__normal_iterator<cali::SnapshotTextFormatter::SnapshotTextFormatterImpl::Field*,std::vector<cali::SnapshotTextFormatter::SnapshotTextFormatterImpl::Field,std::allocator<cali::SnapshotTextFormatter::SnapshotTextFormatterImpl::Field>>>>
            ((vector<cali::SnapshotTextFormatter::SnapshotTextFormatterImpl::Field,std::allocator<cali::SnapshotTextFormatter::SnapshotTextFormatterImpl::Field>>
              *)&local_a8,
             (this->m_fields).
             super__Vector_base<cali::SnapshotTextFormatter::SnapshotTextFormatterImpl::Field,_std::allocator<cali::SnapshotTextFormatter::SnapshotTextFormatterImpl::Field>_>
             ._M_impl.super__Vector_impl_data._M_start,
             (this->m_fields).
             super__Vector_base<cali::SnapshotTextFormatter::SnapshotTextFormatterImpl::Field,_std::allocator<cali::SnapshotTextFormatter::SnapshotTextFormatterImpl::Field>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  local_38 = local_a8.
             super__Vector_base<cali::SnapshotTextFormatter::SnapshotTextFormatterImpl::Field,_std::allocator<cali::SnapshotTextFormatter::SnapshotTextFormatterImpl::Field>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if (local_a8.
      super__Vector_base<cali::SnapshotTextFormatter::SnapshotTextFormatterImpl::Field,_std::allocator<cali::SnapshotTextFormatter::SnapshotTextFormatterImpl::Field>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_a8.
      super__Vector_base<cali::SnapshotTextFormatter::SnapshotTextFormatterImpl::Field,_std::allocator<cali::SnapshotTextFormatter::SnapshotTextFormatterImpl::Field>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_68 = 0;
    pFVar17 = local_a8.
              super__Vector_base<cali::SnapshotTextFormatter::SnapshotTextFormatterImpl::Field,_std::allocator<cali::SnapshotTextFormatter::SnapshotTextFormatterImpl::Field>_>
              ._M_impl.super__Vector_impl_data._M_start;
    local_50 = this;
    local_48 = (pthread_mutex_t *)__mutex;
    do {
      if ((pFVar17->attr_name)._M_string_length != 0) {
        iVar6 = (*local_40->_vptr_CaliperMetadataAccessInterface[2])(local_40,&pFVar17->attr_name);
        (pFVar17->attr).m_node = (Node *)CONCAT44(extraout_var,iVar6);
        (pFVar17->attr_name)._M_string_length = 0;
        *(pFVar17->attr_name)._M_dataplus._M_p = '\0';
        cVar7 = Attribute::type(&pFVar17->attr);
        uVar8 = CONCAT44(extraout_var_00,cVar7);
        if ((CALI_TYPE_DOUBLE < cVar7) || (cVar14 = 'r', (0x4cU >> (cVar7 & 0x1f) & 1) == 0)) {
          uVar8 = 0;
          cVar14 = 'l';
          if (cVar7 == CALI_TYPE_ADDR) {
            cVar14 = 'r';
          }
        }
        pFVar17->align = cVar14;
        local_68 = CONCAT71((int7)((ulong)uVar8 >> 8),1);
      }
      local_c8 = &local_b8;
      local_c0 = 0;
      local_b8 = '\0';
      if ((pFVar17->attr).m_node != (Node *)0x0) {
        for (this_00 = (list->super__Vector_base<cali::Entry,_std::allocator<cali::Entry>_>)._M_impl
                       .super__Vector_impl_data._M_start;
            this_00 !=
            (list->super__Vector_base<cali::Entry,_std::allocator<cali::Entry>_>)._M_impl.
            super__Vector_impl_data._M_finish; this_00 = this_00 + 1) {
          pNVar16 = (pFVar17->attr).m_node;
          if (pNVar16 == (Node *)0x0) {
            cVar10 = 0xffffffffffffffff;
          }
          else {
            cVar10 = pNVar16->m_id;
          }
          iVar6 = Entry::count(this_00,cVar10);
          if (iVar6 != 0) {
            pNVar16 = this_00->m_node;
            uVar15 = (this_00->m_value).m_v.type_and_size;
            aVar9 = (this_00->m_value).m_v.value;
            goto LAB_0018f9cf;
          }
        }
        aVar9.v_uint = 0;
        uVar15 = 0;
        pNVar16 = (Node *)0x0;
LAB_0018f9cf:
        if (pNVar16 != (Node *)0x0) {
          if (pNVar16->m_attribute == 8) {
            if ((pNVar16 != (Node *)0x0) && (pNVar16->m_attribute == 8)) {
              local_60.m_v.type_and_size = uVar15;
              local_60.m_v.value = aVar9;
              Variant::to_string_abi_cxx11_(&local_88,&local_60);
              std::__cxx11::string::_M_append((char *)&local_c8,(ulong)local_88._M_dataplus._M_p);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_88._M_dataplus._M_p != &local_88.field_2) {
                operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1
                               );
              }
            }
          }
          else {
            do {
              pNVar1 = (pFVar17->attr).m_node;
              if (pNVar1 == (Node *)0x0) {
                cVar10 = 0xffffffffffffffff;
              }
              else {
                cVar10 = pNVar1->m_id;
              }
              if (pNVar16->m_attribute == cVar10) {
                local_60.m_v.type_and_size = (pNVar16->m_data).m_v.type_and_size;
                local_60.m_v.value = (pNVar16->m_data).m_v.value;
                Variant::to_string_abi_cxx11_(&local_88,&local_60);
                pcVar11 = (char *)std::__cxx11::string::append((char *)&local_88);
                std::__cxx11::string::_M_append(pcVar11,(ulong)local_c8);
                std::__cxx11::string::_M_assign((string *)&local_c8);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_88._M_dataplus._M_p != &local_88.field_2) {
                  operator_delete(local_88._M_dataplus._M_p,
                                  local_88.field_2._M_allocated_capacity + 1);
                }
              }
              pNVar16 = *(Node **)((long)&(((pNVar16->super_LockfreeIntrusiveTree<cali::Node>).m_me)
                                          ->super_LockfreeIntrusiveTree<cali::Node>).m_me +
                                  (pNVar16->super_LockfreeIntrusiveTree<cali::Node>).m_node);
            } while (pNVar16 != (Node *)0x0);
          }
        }
      }
      iVar6 = pFVar17->width - (int)local_c0;
      if (0x4f < iVar6) {
        iVar6 = 0x50;
      }
      if (pFVar17->width <= (int)local_c0) {
        iVar6 = 0;
      }
      pcVar11 = (pFVar17->prefix)._M_dataplus._M_p;
      sVar2 = (pFVar17->prefix)._M_string_length;
      if (pFVar17->align == 'r') {
        poVar12 = std::__ostream_insert<char,std::char_traits<char>>(local_90,pcVar11,sVar2);
        pcVar11 = "                                                                                "
                  + (0x50 - iVar6);
        if (iVar6 < 1) {
          pcVar11 = "";
        }
        sVar13 = strlen(pcVar11);
        std::__ostream_insert<char,std::char_traits<char>>(poVar12,pcVar11,sVar13);
        std::__ostream_insert<char,std::char_traits<char>>(poVar12,local_c8,local_c0);
      }
      else {
        poVar12 = std::__ostream_insert<char,std::char_traits<char>>(local_90,pcVar11,sVar2);
        poVar12 = std::__ostream_insert<char,std::char_traits<char>>(poVar12,local_c8,local_c0);
        pcVar11 = "                                                                                "
                  + (0x50 - iVar6);
        if (iVar6 < 1) {
          pcVar11 = "";
        }
        sVar13 = strlen(pcVar11);
        std::__ostream_insert<char,std::char_traits<char>>(poVar12,pcVar11,sVar13);
      }
      if (local_c8 != &local_b8) {
        operator_delete(local_c8,CONCAT71(uStack_b7,local_b8) + 1);
      }
      __mutex_00 = local_48;
      pSVar5 = local_50;
      pFVar17 = pFVar17 + 1;
    } while (pFVar17 != local_38);
    if ((local_68 & 1) != 0) {
      iVar6 = pthread_mutex_lock(local_48);
      if (iVar6 != 0) {
        std::__throw_system_error(iVar6);
      }
      pFVar3 = (pSVar5->m_fields).
               super__Vector_base<cali::SnapshotTextFormatter::SnapshotTextFormatterImpl::Field,_std::allocator<cali::SnapshotTextFormatter::SnapshotTextFormatterImpl::Field>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pFVar4 = (pSVar5->m_fields).
               super__Vector_base<cali::SnapshotTextFormatter::SnapshotTextFormatterImpl::Field,_std::allocator<cali::SnapshotTextFormatter::SnapshotTextFormatterImpl::Field>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      pFVar17 = (pSVar5->m_fields).
                super__Vector_base<cali::SnapshotTextFormatter::SnapshotTextFormatterImpl::Field,_std::allocator<cali::SnapshotTextFormatter::SnapshotTextFormatterImpl::Field>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
      (pSVar5->m_fields).
      super__Vector_base<cali::SnapshotTextFormatter::SnapshotTextFormatterImpl::Field,_std::allocator<cali::SnapshotTextFormatter::SnapshotTextFormatterImpl::Field>_>
      ._M_impl.super__Vector_impl_data._M_start =
           local_a8.
           super__Vector_base<cali::SnapshotTextFormatter::SnapshotTextFormatterImpl::Field,_std::allocator<cali::SnapshotTextFormatter::SnapshotTextFormatterImpl::Field>_>
           ._M_impl.super__Vector_impl_data._M_start;
      (pSVar5->m_fields).
      super__Vector_base<cali::SnapshotTextFormatter::SnapshotTextFormatterImpl::Field,_std::allocator<cali::SnapshotTextFormatter::SnapshotTextFormatterImpl::Field>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           local_a8.
           super__Vector_base<cali::SnapshotTextFormatter::SnapshotTextFormatterImpl::Field,_std::allocator<cali::SnapshotTextFormatter::SnapshotTextFormatterImpl::Field>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      (pSVar5->m_fields).
      super__Vector_base<cali::SnapshotTextFormatter::SnapshotTextFormatterImpl::Field,_std::allocator<cali::SnapshotTextFormatter::SnapshotTextFormatterImpl::Field>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           local_a8.
           super__Vector_base<cali::SnapshotTextFormatter::SnapshotTextFormatterImpl::Field,_std::allocator<cali::SnapshotTextFormatter::SnapshotTextFormatterImpl::Field>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_a8.
      super__Vector_base<cali::SnapshotTextFormatter::SnapshotTextFormatterImpl::Field,_std::allocator<cali::SnapshotTextFormatter::SnapshotTextFormatterImpl::Field>_>
      ._M_impl.super__Vector_impl_data._M_start = pFVar3;
      local_a8.
      super__Vector_base<cali::SnapshotTextFormatter::SnapshotTextFormatterImpl::Field,_std::allocator<cali::SnapshotTextFormatter::SnapshotTextFormatterImpl::Field>_>
      ._M_impl.super__Vector_impl_data._M_finish = pFVar4;
      local_a8.
      super__Vector_base<cali::SnapshotTextFormatter::SnapshotTextFormatterImpl::Field,_std::allocator<cali::SnapshotTextFormatter::SnapshotTextFormatterImpl::Field>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = pFVar17;
      pthread_mutex_unlock(__mutex_00);
    }
  }
  std::
  vector<cali::SnapshotTextFormatter::SnapshotTextFormatterImpl::Field,_std::allocator<cali::SnapshotTextFormatter::SnapshotTextFormatterImpl::Field>_>
  ::~vector(&local_a8);
  return local_90;
}

Assistant:

std::ostream& print(std::ostream& os, const CaliperMetadataAccessInterface& db, const std::vector<Entry>& list)
    {
        std::vector<Field> fields;

        {
            std::lock_guard<std::mutex> g(m_field_mutex);

            fields.assign(m_fields.begin(), m_fields.end());
        }

        bool update = false;

        for (Field& f : fields) {
            if (!f.attr_name.empty()) {
                f.attr = db.get_attribute(f.attr_name);
                f.attr_name.clear();

                cali_attr_type type = f.attr.type();

                f.align = (type == CALI_TYPE_DOUBLE || type == CALI_TYPE_INT || type == CALI_TYPE_UINT
                           || type == CALI_TYPE_ADDR)
                              ? 'r'
                              : 'l';

                update = true;
            }

            std::string str;

            if (f.attr) {
                Entry e;

                for (auto it = list.begin(); it != list.end(); ++it)
                    if ((*it).count(f.attr)) {
                        e = *it;
                        break;
                    }

                if (e.is_reference()) {
                    for (const Node* node = e.node(); node; node = node->parent())
                        if (node->attribute() == f.attr.id())
                            str = node->data().to_string().append(str.size() ? "/" : "").append(str);
                } else if (e.is_immediate()) {
                    str.append(e.value().to_string());
                }
            }

            static const char whitespace[80 + 1] =
                "                                        "
                "                                        ";

            int len = str.size();
            int w   = len < f.width ? std::min<int>(f.width - len, 80) : 0;

            if (f.align == 'r')
                os << f.prefix << (w > 0 ? whitespace + (80 - w) : "") << str;
            else
                os << f.prefix << str << (w > 0 ? whitespace + (80 - w) : "");
        }

        if (update) {
            std::lock_guard<std::mutex> g(m_field_mutex);

            m_fields.swap(fields);
        }

        return os;
    }